

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

QPDFObjectHandle __thiscall
QPDF::getUncompressedObject(QPDF *this,QPDFObjectHandle *oh,ObjTable *obj)

{
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  _Base_ptr p_Var5;
  Object *pOVar6;
  ObjTable<QPDFWriter::Object> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Base_ptr extraout_RDX;
  _Base_ptr extraout_RDX_00;
  _Base_ptr extraout_RDX_01;
  _Base_ptr extraout_RDX_02;
  _Base_ptr p_Var8;
  bool bVar9;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle local_48;
  QPDFObjectHandle local_38;
  
  local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (obj->super_ObjTable<QPDFWriter::Object>).
       super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
       super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (obj->super_ObjTable<QPDFWriter::Object>).
       super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
       super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  iVar4 = QPDFObjectHandle::getObjectID(&local_38);
  p_Var5 = (_Base_ptr)(long)iVar4;
  _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (((long)(in_RCX->
                        super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>).
                        super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(in_RCX->
                        super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>).
                        super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  bVar9 = true;
  if (_Var7._M_pi < p_Var5 || (long)_Var7._M_pi - (long)p_Var5 == 0) {
    p_Var1 = &(in_RCX->sparse_elements)._M_t._M_impl.super__Rb_tree_header;
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
    for (p_Var8 = (in_RCX->sparse_elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(_Base_ptr *)(p_Var8 + 1) < p_Var5])
    {
      if (*(_Base_ptr *)(p_Var8 + 1) >= p_Var5) {
        _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8;
      }
    }
    p_Var8 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)_Var7._M_pi != p_Var1) &&
       (p_Var8 = (_Base_ptr)_Var7._M_pi, p_Var5 < *(_Base_ptr *)((long)_Var7._M_pi + 0x20))) {
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
      p_Var8 = &p_Var1->_M_header;
    }
    bVar9 = (_Rb_tree_header *)p_Var8 != p_Var1;
  }
  if (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
  }
  if (bVar9) {
    local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)
           (obj->super_ObjTable<QPDFWriter::Object>).
           super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
           super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
           super__Vector_impl_data._M_start;
    local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (obj->super_ObjTable<QPDFWriter::Object>).
         super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
         super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_48.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_48.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    iVar4 = QPDFObjectHandle::getObjectID(&local_48);
    pOVar6 = ObjTable<QPDFWriter::Object>::element(in_RCX,(long)iVar4);
    iVar4 = pOVar6->object_stream;
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
    if (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
    }
    if (0 < iVar4) {
      bVar9 = QPDFObjectHandle::isNull((QPDFObjectHandle *)obj);
      if (bVar9) {
        (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
        _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
             (Members *)
             (obj->super_ObjTable<QPDFWriter::Object>).
             super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
             super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
             super__Vector_impl_data._M_start;
        _Var2._M_head_impl =
             (Members *)
             (obj->super_ObjTable<QPDFWriter::Object>).
             super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
             super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
             super__Vector_impl_data._M_finish;
        this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
        _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
        super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var2._M_head_impl;
        _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_02;
        if (_Var2._M_head_impl != (Members *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var2._M_head_impl)->log + 8);
            *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var2._M_head_impl)->log + 8);
            *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
          }
        }
      }
      else {
        QVar10 = getObject(this,(int)oh,iVar4);
        _Var7._M_pi = QVar10.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      }
      if (0 < iVar4) goto LAB_0021b1f3;
    }
  }
  (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
       (Members *)
       (obj->super_ObjTable<QPDFWriter::Object>).
       super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
       super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var2._M_head_impl =
       (Members *)
       (obj->super_ObjTable<QPDFWriter::Object>).
       super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
       super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
       super__Vector_impl_data._M_finish;
  this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var2._M_head_impl != (Members *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var2._M_head_impl)->log + 8);
      *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var3 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var2._M_head_impl)->log + 8);
      *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
    }
  }
LAB_0021b1f3:
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var7._M_pi;
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::getUncompressedObject(QPDFObjectHandle& oh, QPDFWriter::ObjTable const& obj)
{
    if (obj.contains(oh)) {
        if (auto id = obj[oh].object_stream; id > 0) {
            return oh.isNull() ? oh : getObject(id, 0);
        }
    }
    return oh;
}